

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-full.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  undefined8 *in_RSI;
  int in_EDI;
  Parameters parameters;
  Callback cbAudio;
  AudioLogger audioLogger;
  ofstream fout;
  size_t totalSize_bytes;
  bool doRecord;
  int nChannels;
  int captureId;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  size_t *in_stack_fffffffffffffbf8;
  undefined6 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc06;
  undefined1 in_stack_fffffffffffffc07;
  int in_stack_fffffffffffffc0c;
  mapped_type *in_stack_fffffffffffffc10;
  function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
  *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  int iVar4;
  int iVar5;
  allocator<char> *in_stack_fffffffffffffc30;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  mapped_type *in_stack_fffffffffffffc40;
  int local_3ac;
  allocator<char> *paVar6;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  char **in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc7c;
  undefined4 in_stack_fffffffffffffcb4;
  AudioLogger *this;
  undefined1 local_300 [512];
  undefined8 local_100;
  undefined1 local_f4 [4];
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [32];
  int local_a8;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [36];
  int local_44;
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Usage: %s output.kbd [-cN]\n",*in_RSI);
  printf("    -cN - select capture device N\n");
  printf("    -CN - number N of capture channels N\n");
  printf("\n");
  if (local_8 < 2) {
    local_4 = -0x7f;
  }
  else {
    parseCmdArguments_abi_cxx11_(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc70);
    paVar6 = &local_69;
    std::allocator<char>::allocator();
    local_a2 = 0;
    local_a3 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc40,
               (char *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc30);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffc40,
                 (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      local_a2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc40,
                 (char *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                 in_stack_fffffffffffffc30);
      local_a3 = 1;
      in_stack_fffffffffffffc40 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffc40,
                        (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      in_stack_fffffffffffffc3c =
           std::__cxx11::stoi((string *)
                              CONCAT17(in_stack_fffffffffffffc07,
                                       CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)
                                      ),in_stack_fffffffffffffbf8,0);
      local_3ac = in_stack_fffffffffffffc3c;
    }
    else {
      local_3ac = 0;
    }
    if ((local_a3 & 1) != 0) {
      std::__cxx11::string::~string(local_a0);
    }
    if ((local_a2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_a1);
    }
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    __a = &local_c9;
    local_44 = local_3ac;
    std::allocator<char>::allocator();
    local_f4[2] = 0;
    local_f4[1] = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc40,(char *)CONCAT44(in_stack_fffffffffffffc3c,local_3ac),__a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffc40,
                 (key_type *)CONCAT44(in_stack_fffffffffffffc3c,local_3ac));
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      in_stack_fffffffffffffc18 =
           (function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
            *)(local_f4 + 3);
      std::allocator<char>::allocator();
      local_f4[2] = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc40,(char *)CONCAT44(in_stack_fffffffffffffc3c,local_3ac),__a
                );
      local_f4[1] = 1;
      in_stack_fffffffffffffc10 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffc40,
                        (key_type *)CONCAT44(in_stack_fffffffffffffc3c,local_3ac));
      in_stack_fffffffffffffc0c =
           std::__cxx11::stoi((string *)
                              CONCAT17(in_stack_fffffffffffffc07,
                                       CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)
                                      ),in_stack_fffffffffffffbf8,0);
      iVar4 = in_stack_fffffffffffffc0c;
    }
    else {
      iVar4 = 0;
    }
    iVar5 = iVar4;
    if ((local_f4[1] & 1) != 0) {
      std::__cxx11::string::~string(local_f0);
    }
    if ((local_f4[2] & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(local_f4 + 3));
    }
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    local_f4[0] = 1;
    local_100 = 0;
    local_a8 = iVar4;
    std::ofstream::ofstream(local_300,(char *)local_10[1],_S_bin);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      fprintf(_stderr,"Failed to open file \'%s\'\n",local_10[1]);
      local_4 = -1;
    }
    else {
      AudioLogger::AudioLogger((AudioLogger *)in_stack_fffffffffffffc10);
      this = (AudioLogger *)local_f4;
      std::
      function<void(std::vector<std::array<float,512ul>,std::allocator<std::array<float,512ul>>>const&)>
      ::function<main::__0,void>
                ((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                  *)in_stack_fffffffffffffc10,
                 (anon_class_24_3_bffedd68 *)CONCAT44(in_stack_fffffffffffffc0c,iVar4));
      AudioLogger::Parameters::Parameters
                ((Parameters *)
                 CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)));
      std::
      function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
      ::operator=((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                   *)CONCAT44(iVar5,in_stack_fffffffffffffc20),in_stack_fffffffffffffc18);
      bVar2 = AudioLogger::install
                        (this,(Parameters *)CONCAT44(in_stack_fffffffffffffcb4,0x42c80000));
      if (bVar2) {
        do {
          while ((local_f4[0] & 1) != 0) {
            local_f4[0] = 0;
            AudioLogger::record((AudioLogger *)
                                CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                                (float)((ulong)paVar6 >> 0x20),(int32_t)paVar6);
          }
          in_stack_fffffffffffffc6c = 1;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1000l>> *)&stack0xfffffffffffffc70,
                     (int *)&stack0xfffffffffffffc6c);
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)__a);
        } while( true );
      }
      fprintf(_stderr,"Failed to install audio logger\n");
      local_4 = -1;
      AudioLogger::Parameters::~Parameters((Parameters *)0x13640e);
      std::
      function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
      ::~function((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                   *)0x13641b);
      AudioLogger::~AudioLogger((AudioLogger *)0x136428);
    }
    std::ofstream::~ofstream(local_300);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1364f9);
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s output.kbd [-cN]\n", argv[0]);
    printf("    -cN - select capture device N\n");
    printf("    -CN - number N of capture channels N\n");
    printf("\n");

    if (argc < 2) {
        return -127;
    }

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int nChannels = argm["C"].empty() ? 0 : std::stoi(argm["C"]);

    bool doRecord = true;
    size_t totalSize_bytes = 0;

    std::ofstream fout(argv[1], std::ios::binary);
    if (fout.good() == false) {
        fprintf(stderr, "Failed to open file '%s'\n", argv[1]);
        return -1;
    }

    AudioLogger audioLogger;
    AudioLogger::Callback cbAudio = [&](const auto & frames) {
        doRecord = true;

        for (const auto & frame : frames) {
            totalSize_bytes += sizeof(frame[0])*frame.size();
            fout.write((char *)(frame.data()), sizeof(frame[0])*frame.size());
            fout.flush();
        }

        printf("Total data saved: %g MB\n", ((float)(totalSize_bytes)/1024.0f/1024.0f));
    };

    AudioLogger::Parameters parameters;
    parameters.callback = std::move(cbAudio);
    parameters.captureId = captureId;
    parameters.nChannels = nChannels;
    parameters.sampleRate = kSampleRate;
    parameters.filter = EAudioFilter::None;
    parameters.freqCutoff_Hz = kFreqCutoff_Hz;

    if (audioLogger.install(std::move(parameters)) == false) {
        fprintf(stderr, "Failed to install audio logger\n");
        return -1;
    }

    while (true) {
        if (doRecord) {
            doRecord = false;
            audioLogger.record(0.5f, 0);
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(1));
        }
    }

    return 0;
}